

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  pointer *pppTVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  unsigned_long uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *this_01;
  iterator __position;
  SubGridBuildData *pSVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  char *pcVar20;
  float *pfVar21;
  size_t sVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint y [4];
  uint x [4];
  uint geomIDs [4];
  AABBNode node;
  uint primID [4];
  BBox3fa bounds [4];
  MutexSys *local_210 [2];
  ThreadLocal2 *local_200 [2];
  float local_1f0 [6];
  BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *local_1d8;
  unsigned_long local_1d0;
  unsigned_long local_1c8;
  MutexSys *local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 local_1a0 [36];
  uint auStack_110 [4];
  undefined8 local_100;
  char local_f8 [8];
  undefined4 auStack_f0 [48];
  
  local_1d8 = this;
  uVar7 = set->_begin;
  local_1d0 = set->_end;
  uVar29 = set->_end - uVar7;
  local_1c8 = uVar7;
  local_1f0[0] = prims[uVar7].lower.field_0.m128[3];
  uVar19 = 1;
  if (1 < uVar29) {
    uVar27 = 1;
    do {
      fVar5 = prims[uVar7 + uVar27].lower.field_0.m128[3];
      uVar24 = (ulong)uVar19;
      if (uVar19 != 0) {
        uVar25 = 0;
        do {
          if (fVar5 == local_1f0[uVar25]) goto LAB_01392528;
          uVar25 = uVar25 + 1;
        } while (uVar24 != uVar25);
      }
      uVar19 = uVar19 + 1;
      local_1f0[uVar24] = fVar5;
LAB_01392528:
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar29);
  }
  uVar27 = (ulong)uVar19;
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  local_210[0] = (MutexSys *)(uVar27 * 0x58);
  this_01 = pTVar8->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_f8[0] = '\x01';
    local_100 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_1c0 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_1b8 = CONCAT71(uStack_1b8._1_7_,1);
    local_200[0] = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,local_200);
    }
    else {
      *__position._M_current = local_200[0];
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if ((char)uStack_1b8 == '\x01') {
      MutexSys::unlock(local_1c0);
    }
    if (local_f8[0] == '\x01') {
      MutexSys::unlock(&local_100->mutex);
    }
  }
  pTVar8->bytesUsed = (long)&local_210[0]->mutex + pTVar8->bytesUsed;
  sVar22 = pTVar8->cur;
  uVar25 = (ulong)(-(int)sVar22 & 0xf);
  uVar24 = (long)&local_210[0]->mutex + uVar25 + sVar22;
  pTVar8->cur = uVar24;
  if (pTVar8->end < uVar24) {
    pTVar8->cur = sVar22;
    if ((MutexSys *)pTVar8->allocBlockSize < (MutexSys *)((long)local_210[0] << 2)) {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_210);
    }
    else {
      local_1c0 = (MutexSys *)pTVar8->allocBlockSize;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_1c0);
      pTVar8->ptr = pcVar20;
      sVar22 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar22;
      pTVar8->cur = 0;
      pTVar8->end = (size_t)local_1c0;
      pTVar8->cur = (size_t)local_210[0];
      if (local_1c0 < local_210[0]) {
        pTVar8->cur = 0;
        local_1c0 = (MutexSys *)pTVar8->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_1c0);
        pTVar8->ptr = pcVar20;
        sVar22 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar22;
        pTVar8->cur = 0;
        pTVar8->end = (size_t)local_1c0;
        pTVar8->cur = (size_t)local_210[0];
        if (local_1c0 < local_210[0]) {
          pTVar8->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_01392702;
        }
      }
      pTVar8->bytesWasted = sVar22;
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar25;
    pcVar20 = pTVar8->ptr + (uVar24 - (long)local_210[0]);
  }
LAB_01392702:
  if (uVar27 != 0) {
    uVar24 = 0;
    auVar44 = ZEXT816(0) << 0x40;
    auVar43._8_4_ = 0x7f800000;
    auVar43._0_8_ = 0x7f8000007f800000;
    auVar43._12_4_ = 0x7f800000;
    pcVar23 = pcVar20;
    do {
      uVar19 = 0;
      if (local_1d0 != local_1c8) {
        fVar5 = local_1f0[uVar24];
        pSVar9 = (local_1d8->createLeafFunc).sgrids;
        uVar19 = 0;
        pfVar21 = prims[uVar7].upper.field_0.m128 + 3;
        uVar25 = uVar29;
        do {
          if (pfVar21[-4] == fVar5) {
            fVar6 = *pfVar21;
            uVar30 = (ulong)uVar19;
            local_1f0[uVar30 - 4] = (float)(uint)pSVar9[(uint)fVar6].sx;
            *(uint *)((long)local_210 + uVar30 * 4) = (uint)pSVar9[(uint)fVar6].sy;
            auStack_110[uVar30] = pSVar9[(uint)fVar6].primID;
            *(undefined1 (*) [32])(local_f8 + uVar30 * 0x20 + -8) =
                 *(undefined1 (*) [32])(pfVar21 + -7);
            uVar19 = uVar19 + 1;
          }
          pfVar21 = pfVar21 + 8;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      lVar26 = uVar24 * 0x58;
      fVar5 = local_1f0[uVar24];
      pcVar2 = pcVar20 + lVar26;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = -1;
      pcVar2[5] = -1;
      pcVar2[6] = -1;
      pcVar2[7] = -1;
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = -1;
      pcVar2[0xd] = -1;
      pcVar2[0xe] = -1;
      pcVar2[0xf] = -1;
      pcVar2[0x10] = '\0';
      pcVar2[0x11] = '\0';
      pcVar2[0x12] = '\0';
      pcVar2[0x13] = '\0';
      pcVar2[0x14] = -1;
      pcVar2[0x15] = -1;
      pcVar2[0x16] = -1;
      pcVar2[0x17] = -1;
      pcVar2[0x18] = '\0';
      pcVar2[0x19] = '\0';
      pcVar2[0x1a] = '\0';
      pcVar2[0x1b] = '\0';
      pcVar2[0x1c] = -1;
      pcVar2[0x1d] = -1;
      pcVar2[0x1e] = -1;
      pcVar2[0x1f] = -1;
      pcVar2 = pcVar20 + lVar26 + 0x20;
      pcVar2[0] = -1;
      pcVar2[1] = -1;
      pcVar2[2] = -1;
      pcVar2[3] = -1;
      pcVar2 = pcVar20 + lVar26 + 0x30;
      pcVar2[0] = -1;
      pcVar2[1] = -1;
      pcVar2[2] = -1;
      pcVar2[3] = -1;
      pcVar2 = pcVar20 + lVar26 + 0x28;
      pcVar2[0] = -1;
      pcVar2[1] = -1;
      pcVar2[2] = -1;
      pcVar2[3] = -1;
      pcVar2 = pcVar20 + lVar26 + 0x24;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2 = pcVar20 + lVar26 + 0x34;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2 = pcVar20 + lVar26 + 0x2c;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      *(float *)(pcVar20 + lVar26 + 0x50) = fVar5;
      local_1a0[0x10] = 0x7f800000;
      local_1a0[0x11] = 0x7f800000;
      local_1a0[0x12] = 0x7f800000;
      local_1a0[0x13] = 0x7f800000;
      local_1a0[8] = 0x7f800000;
      local_1a0[9] = 0x7f800000;
      local_1a0[10] = 0x7f800000;
      local_1a0[0xb] = 0x7f800000;
      local_1a0[0] = 0x7f800000;
      local_1a0[1] = 0x7f800000;
      local_1a0[2] = 0x7f800000;
      local_1a0[3] = 0x7f800000;
      local_1a0[0x14] = 0xff800000;
      local_1a0[0x15] = 0xff800000;
      local_1a0[0x16] = 0xff800000;
      local_1a0[0x17] = 0xff800000;
      local_1a0[0xc] = 0xff800000;
      local_1a0[0xd] = 0xff800000;
      local_1a0[0xe] = 0xff800000;
      local_1a0[0xf] = 0xff800000;
      local_1a0[4] = 0xff800000;
      local_1a0[5] = 0xff800000;
      local_1a0[6] = 0xff800000;
      local_1a0[7] = 0xff800000;
      local_1c0 = (MutexSys *)0x8;
      uStack_1b8 = 8;
      uStack_1b0 = 8;
      uStack_1a8 = 8;
      if (uVar19 != 0) {
        lVar28 = 0;
        do {
          *(ulong *)(pcVar23 + lVar28 * 2) =
               CONCAT44(*(undefined4 *)((long)auStack_110 + lVar28),
                        *(int *)((long)local_210 + lVar28) << 0x10 |
                        (uint)*(ushort *)((long)local_200 + lVar28));
          uVar4 = *(undefined4 *)(local_f8 + lVar28 * 8 + -4);
          *(undefined4 *)((long)local_1a0 + lVar28) = *(undefined4 *)(local_f8 + lVar28 * 8 + -8);
          *(undefined4 *)((long)local_1a0 + lVar28 + 0x20) = uVar4;
          *(undefined4 *)((long)local_1a0 + lVar28 + 0x40) = *(undefined4 *)(local_f8 + lVar28 * 8);
          *(undefined4 *)((long)local_1a0 + lVar28 + 0x10) = auStack_f0[lVar28 * 2];
          *(undefined4 *)((long)local_1a0 + lVar28 + 0x30) = auStack_f0[lVar28 * 2 + 1];
          *(undefined4 *)((long)local_1a0 + lVar28 + 0x50) = auStack_f0[lVar28 * 2 + 2];
          lVar28 = lVar28 + 4;
        } while ((ulong)uVar19 << 2 != lVar28);
      }
      auVar14._4_4_ = local_1a0[1];
      auVar14._0_4_ = local_1a0[0];
      auVar14._8_4_ = local_1a0[2];
      auVar14._12_4_ = local_1a0[3];
      auVar15._4_4_ = local_1a0[5];
      auVar15._0_4_ = local_1a0[4];
      auVar15._8_4_ = local_1a0[6];
      auVar15._12_4_ = local_1a0[7];
      auVar31 = vshufps_avx(auVar14,auVar14,0xb1);
      auVar31 = vminps_avx(auVar31,auVar14);
      auVar11 = vshufpd_avx(auVar31,auVar31,1);
      auVar10 = vminps_avx(auVar11,auVar31);
      auVar31 = vshufps_avx(auVar15,auVar15,0xb1);
      auVar31 = vmaxps_avx(auVar31,auVar15);
      auVar11 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vmaxss_avx(auVar11,auVar31);
      fVar5 = (auVar31._0_4_ - auVar10._0_4_) * 1.0000002;
      auVar31 = vcmpss_avx(ZEXT416((uint)(fVar5 / 255.0)),auVar44,0);
      auVar11 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar31);
      auVar31 = vcmpss_avx(auVar44,ZEXT416((uint)fVar5),1);
      auVar31 = vandps_avx(auVar31,ZEXT416((uint)(255.0 / fVar5)));
      auVar40 = vshufps_avx(auVar10,auVar10,0);
      auVar32 = vsubps_avx(auVar14,auVar40);
      auVar12 = vshufps_avx(auVar31,auVar31,0);
      auVar31._0_4_ = auVar12._0_4_ * auVar32._0_4_;
      auVar31._4_4_ = auVar12._4_4_ * auVar32._4_4_;
      auVar31._8_4_ = auVar12._8_4_ * auVar32._8_4_;
      auVar31._12_4_ = auVar12._12_4_ * auVar32._12_4_;
      auVar31 = vroundps_avx(auVar31,1);
      auVar31 = vcvtps2dq_avx(auVar31);
      auVar33 = vpmaxsd_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vsubps_avx(auVar15,auVar40);
      auVar38._0_4_ = auVar12._0_4_ * auVar31._0_4_;
      auVar38._4_4_ = auVar12._4_4_ * auVar31._4_4_;
      auVar38._8_4_ = auVar12._8_4_ * auVar31._8_4_;
      auVar38._12_4_ = auVar12._12_4_ * auVar31._12_4_;
      auVar31 = vroundps_avx(auVar38,2);
      auVar31 = vcvtps2dq_avx(auVar31);
      auVar34._8_4_ = 0xff;
      auVar34._0_8_ = 0xff000000ff;
      auVar34._12_4_ = 0xff;
      auVar38 = vpminsd_avx(auVar31,auVar34);
      auVar31 = vcvtdq2ps_avx(auVar33);
      auVar13 = vshufps_avx(auVar11,auVar11,0);
      auVar32 = vcvtdq2ps_avx(auVar38);
      auVar12 = vcmpps_avx(auVar14,auVar43,4);
      auVar45._0_4_ = auVar40._0_4_ + auVar31._0_4_ * auVar13._0_4_;
      auVar45._4_4_ = auVar40._4_4_ + auVar31._4_4_ * auVar13._4_4_;
      auVar45._8_4_ = auVar40._8_4_ + auVar31._8_4_ * auVar13._8_4_;
      auVar45._12_4_ = auVar40._12_4_ + auVar31._12_4_ * auVar13._12_4_;
      auVar35._0_4_ = auVar40._0_4_ + auVar13._0_4_ * auVar32._0_4_;
      auVar35._4_4_ = auVar40._4_4_ + auVar13._4_4_ * auVar32._4_4_;
      auVar35._8_4_ = auVar40._8_4_ + auVar13._8_4_ * auVar32._8_4_;
      auVar35._12_4_ = auVar40._12_4_ + auVar13._12_4_ * auVar32._12_4_;
      auVar31 = vcmpps_avx(auVar45,auVar14,6);
      auVar31 = vpaddd_avx(auVar31,auVar33);
      auVar32 = vpmaxsd_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vcmpps_avx(auVar35,auVar15,1);
      auVar31 = vpsubd_avx(auVar38,auVar31);
      auVar33 = vpminsd_avx(auVar31,auVar34);
      auVar31 = vblendvps_avx(auVar34,auVar32,auVar12);
      auVar32 = vpackusdw_avx(auVar31,auVar31);
      auVar31 = vandps_avx(auVar12,auVar33);
      auVar31 = vpackusdw_avx(auVar31,auVar31);
      auVar31 = vpackuswb_avx(auVar32,auVar31);
      auVar31 = vpshufd_avx(auVar31,0xd8);
      *(long *)(pcVar20 + lVar26 + 0x20) = auVar31._0_8_;
      *(float *)(pcVar20 + lVar26 + 0x38) = auVar10._0_4_;
      *(int *)(pcVar20 + lVar26 + 0x44) = auVar11._0_4_;
      auVar16._4_4_ = local_1a0[9];
      auVar16._0_4_ = local_1a0[8];
      auVar16._8_4_ = local_1a0[10];
      auVar16._12_4_ = local_1a0[0xb];
      auVar17._4_4_ = local_1a0[0xd];
      auVar17._0_4_ = local_1a0[0xc];
      auVar17._8_4_ = local_1a0[0xe];
      auVar17._12_4_ = local_1a0[0xf];
      auVar31 = vshufps_avx(auVar16,auVar16,0xb1);
      auVar31 = vminps_avx(auVar31,auVar16);
      auVar11 = vshufpd_avx(auVar31,auVar31,1);
      auVar10 = vminps_avx(auVar11,auVar31);
      auVar31 = vshufps_avx(auVar17,auVar17,0xb1);
      auVar31 = vmaxps_avx(auVar31,auVar17);
      auVar11 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vmaxss_avx(auVar11,auVar31);
      fVar5 = (auVar31._0_4_ - auVar10._0_4_) * 1.0000002;
      auVar31 = vcmpss_avx(auVar44,ZEXT416((uint)(fVar5 / 255.0)),0);
      auVar11 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar31);
      auVar31 = vcmpss_avx(auVar44,ZEXT416((uint)fVar5),1);
      auVar31 = vandps_avx(auVar31,ZEXT416((uint)(255.0 / fVar5)));
      auVar40 = vshufps_avx(auVar10,auVar10,0);
      auVar32 = vsubps_avx(auVar16,auVar40);
      auVar12 = vshufps_avx(auVar31,auVar31,0);
      auVar39._0_4_ = auVar32._0_4_ * auVar12._0_4_;
      auVar39._4_4_ = auVar32._4_4_ * auVar12._4_4_;
      auVar39._8_4_ = auVar32._8_4_ * auVar12._8_4_;
      auVar39._12_4_ = auVar32._12_4_ * auVar12._12_4_;
      auVar31 = vroundps_avx(auVar39,1);
      auVar31 = vcvtps2dq_avx(auVar31);
      auVar33 = vpmaxsd_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vsubps_avx(auVar17,auVar40);
      auVar32._0_4_ = auVar31._0_4_ * auVar12._0_4_;
      auVar32._4_4_ = auVar31._4_4_ * auVar12._4_4_;
      auVar32._8_4_ = auVar31._8_4_ * auVar12._8_4_;
      auVar32._12_4_ = auVar31._12_4_ * auVar12._12_4_;
      auVar31 = vroundps_avx(auVar32,2);
      auVar31 = vcvtps2dq_avx(auVar31);
      auVar38 = vpminsd_avx(auVar31,auVar34);
      auVar31 = vcvtdq2ps_avx(auVar33);
      auVar13 = vshufps_avx(auVar11,auVar11,0);
      auVar32 = vcvtdq2ps_avx(auVar38);
      auVar12 = vcmpps_avx(auVar16,auVar43,4);
      auVar41._0_4_ = auVar40._0_4_ + auVar13._0_4_ * auVar31._0_4_;
      auVar41._4_4_ = auVar40._4_4_ + auVar13._4_4_ * auVar31._4_4_;
      auVar41._8_4_ = auVar40._8_4_ + auVar13._8_4_ * auVar31._8_4_;
      auVar41._12_4_ = auVar40._12_4_ + auVar13._12_4_ * auVar31._12_4_;
      auVar36._0_4_ = auVar13._0_4_ * auVar32._0_4_ + auVar40._0_4_;
      auVar36._4_4_ = auVar13._4_4_ * auVar32._4_4_ + auVar40._4_4_;
      auVar36._8_4_ = auVar13._8_4_ * auVar32._8_4_ + auVar40._8_4_;
      auVar36._12_4_ = auVar13._12_4_ * auVar32._12_4_ + auVar40._12_4_;
      auVar31 = vcmpps_avx(auVar41,auVar16,6);
      auVar31 = vpaddd_avx(auVar33,auVar31);
      auVar32 = vpmaxsd_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vcmpps_avx(auVar36,auVar17,1);
      auVar31 = vpsubd_avx(auVar38,auVar31);
      auVar33 = vpminsd_avx(auVar31,auVar34);
      auVar31 = vblendvps_avx(auVar34,auVar32,auVar12);
      auVar32 = vpackusdw_avx(auVar31,auVar31);
      auVar31 = vandps_avx(auVar12,auVar33);
      auVar31 = vpackusdw_avx(auVar31,auVar31);
      auVar31 = vpackuswb_avx(auVar32,auVar31);
      auVar31 = vpshufd_avx(auVar31,0xd8);
      *(long *)(pcVar20 + lVar26 + 0x28) = auVar31._0_8_;
      *(float *)(pcVar20 + lVar26 + 0x3c) = auVar10._0_4_;
      *(int *)(pcVar20 + lVar26 + 0x48) = auVar11._0_4_;
      auVar13._4_4_ = local_1a0[0x11];
      auVar13._0_4_ = local_1a0[0x10];
      auVar13._8_4_ = local_1a0[0x12];
      auVar13._12_4_ = local_1a0[0x13];
      auVar18._4_4_ = local_1a0[0x15];
      auVar18._0_4_ = local_1a0[0x14];
      auVar18._8_4_ = local_1a0[0x16];
      auVar18._12_4_ = local_1a0[0x17];
      auVar31 = vshufps_avx(auVar13,auVar13,0xb1);
      auVar31 = vminps_avx(auVar31,auVar13);
      auVar11 = vshufpd_avx(auVar31,auVar31,1);
      auVar32 = vminps_avx(auVar11,auVar31);
      auVar31 = vshufps_avx(auVar18,auVar18,0xb1);
      auVar31 = vmaxps_avx(auVar31,auVar18);
      auVar11 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vmaxss_avx(auVar11,auVar31);
      fVar5 = (auVar31._0_4_ - auVar32._0_4_) * 1.0000002;
      auVar31 = vcmpss_avx(auVar44,ZEXT416((uint)(fVar5 / 255.0)),0);
      auVar11 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar31);
      auVar31 = vcmpss_avx(auVar44,ZEXT416((uint)fVar5),1);
      auVar31 = vandps_avx(auVar31,ZEXT416((uint)(255.0 / fVar5)));
      auVar38 = vshufps_avx(auVar32,auVar32,0);
      auVar10 = vsubps_avx(auVar13,auVar38);
      auVar12 = vshufps_avx(auVar31,auVar31,0);
      auVar40._0_4_ = auVar10._0_4_ * auVar12._0_4_;
      auVar40._4_4_ = auVar10._4_4_ * auVar12._4_4_;
      auVar40._8_4_ = auVar10._8_4_ * auVar12._8_4_;
      auVar40._12_4_ = auVar10._12_4_ * auVar12._12_4_;
      auVar31 = vroundps_avx(auVar40,1);
      auVar31 = vcvtps2dq_avx(auVar31);
      auVar10 = vpmaxsd_avx(auVar31,(undefined1  [16])0x0);
      auVar31 = vsubps_avx(auVar18,auVar38);
      auVar33._0_4_ = auVar31._0_4_ * auVar12._0_4_;
      auVar33._4_4_ = auVar31._4_4_ * auVar12._4_4_;
      auVar33._8_4_ = auVar31._8_4_ * auVar12._8_4_;
      auVar33._12_4_ = auVar31._12_4_ * auVar12._12_4_;
      auVar31 = vroundps_avx(auVar33,2);
      auVar31 = vcvtps2dq_avx(auVar31);
      auVar33 = vpminsd_avx(auVar31,auVar34);
      auVar31 = vcvtdq2ps_avx(auVar10);
      auVar40 = vshufps_avx(auVar11,auVar11,0);
      auVar12 = vcvtdq2ps_avx(auVar33);
      auVar42._0_4_ = auVar38._0_4_ + auVar40._0_4_ * auVar31._0_4_;
      auVar42._4_4_ = auVar38._4_4_ + auVar40._4_4_ * auVar31._4_4_;
      auVar42._8_4_ = auVar38._8_4_ + auVar40._8_4_ * auVar31._8_4_;
      auVar42._12_4_ = auVar38._12_4_ + auVar40._12_4_ * auVar31._12_4_;
      auVar37._0_4_ = auVar40._0_4_ * auVar12._0_4_ + auVar38._0_4_;
      auVar37._4_4_ = auVar40._4_4_ * auVar12._4_4_ + auVar38._4_4_;
      auVar37._8_4_ = auVar40._8_4_ * auVar12._8_4_ + auVar38._8_4_;
      auVar37._12_4_ = auVar40._12_4_ * auVar12._12_4_ + auVar38._12_4_;
      auVar31 = vcmpps_avx(auVar42,auVar13,6);
      auVar12 = vpaddd_avx(auVar10,auVar31);
      auVar31 = vcmpps_avx(auVar37,auVar18,1);
      auVar10 = vpsubd_avx(auVar33,auVar31);
      auVar31 = vcmpps_avx(auVar13,auVar43,4);
      auVar12 = vpmaxsd_avx(auVar12,(undefined1  [16])0x0);
      auVar12 = vblendvps_avx(auVar34,auVar12,auVar31);
      auVar10 = vpminsd_avx(auVar10,auVar34);
      auVar31 = vandps_avx(auVar31,auVar10);
      auVar12 = vpackusdw_avx(auVar12,auVar12);
      auVar31 = vpackusdw_avx(auVar31,auVar31);
      auVar31 = vpackuswb_avx(auVar12,auVar31);
      auVar31 = vpshufd_avx(auVar31,0xd8);
      *(long *)(pcVar20 + lVar26 + 0x30) = auVar31._0_8_;
      *(float *)(pcVar20 + lVar26 + 0x40) = auVar32._0_4_;
      *(int *)(pcVar20 + lVar26 + 0x4c) = auVar11._0_4_;
      uVar24 = uVar24 + 1;
      pcVar23 = pcVar23 + 0x58;
    } while (uVar24 != uVar27);
  }
  uVar29 = 7;
  if (uVar27 < 7) {
    uVar29 = uVar27;
  }
  return (NodeRef)(uVar29 | (ulong)pcVar20 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }